

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void FT_CMap_Done(FT_CMap_conflict cmap)

{
  FT_CharMap pFVar1;
  FT_Free_Func p_Var2;
  FT_CharMap last_charmap;
  int local_28;
  FT_Int j;
  FT_Int i;
  FT_Error error;
  FT_Memory memory;
  FT_Face face;
  FT_CMap_conflict cmap_local;
  
  if (cmap != (FT_CMap_conflict)0x0) {
    memory = (FT_Memory)(cmap->charmap).face;
    _i = ((FT_Face)memory)->memory;
    for (local_28 = 0; local_28 < ((FT_Face)memory)->num_charmaps; local_28 = local_28 + 1) {
      if ((FT_CMap_conflict)((FT_Face)memory)->charmaps[local_28] == cmap) {
        pFVar1 = ((FT_Face)memory)->charmaps[((FT_Face)memory)->num_charmaps + -1];
        face = (FT_Face)cmap;
        p_Var2 = (FT_Free_Func)
                 ft_mem_realloc(_i,8,(long)((FT_Face)memory)->num_charmaps,
                                (long)(((FT_Face)memory)->num_charmaps + -1),
                                ((FT_Face)memory)->charmaps,&j);
        memory[2].free = p_Var2;
        if (j != 0) {
          return;
        }
        while (last_charmap._4_4_ = local_28 + 1, last_charmap._4_4_ < *(int *)&memory[2].alloc) {
          if (last_charmap._4_4_ == *(int *)&memory[2].alloc + -1) {
            *(FT_CharMap *)(memory[2].free + (long)local_28 * 8) = pFVar1;
            local_28 = last_charmap._4_4_;
          }
          else {
            *(undefined8 *)(memory[2].free + (long)local_28 * 8) =
                 *(undefined8 *)(memory[2].free + (long)last_charmap._4_4_ * 8);
            local_28 = last_charmap._4_4_;
          }
        }
        *(int *)&memory[2].alloc = *(int *)&memory[2].alloc + -1;
        if ((FT_Face)memory[5].alloc == face) {
          memory[5].alloc = (FT_Alloc_Func)0x0;
        }
        ft_cmap_done_internal((FT_CMap_conflict)face);
        return;
      }
    }
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_CMap_Done( FT_CMap  cmap )
  {
    if ( cmap )
    {
      FT_Face    face   = cmap->charmap.face;
      FT_Memory  memory = FT_FACE_MEMORY( face );
      FT_Error   error;
      FT_Int     i, j;


      for ( i = 0; i < face->num_charmaps; i++ )
      {
        if ( (FT_CMap)face->charmaps[i] == cmap )
        {
          FT_CharMap  last_charmap = face->charmaps[face->num_charmaps - 1];


          if ( FT_RENEW_ARRAY( face->charmaps,
                               face->num_charmaps,
                               face->num_charmaps - 1 ) )
            return;

          /* remove it from our list of charmaps */
          for ( j = i + 1; j < face->num_charmaps; j++ )
          {
            if ( j == face->num_charmaps - 1 )
              face->charmaps[j - 1] = last_charmap;
            else
              face->charmaps[j - 1] = face->charmaps[j];
          }

          face->num_charmaps--;

          if ( (FT_CMap)face->charmap == cmap )
            face->charmap = NULL;

          ft_cmap_done_internal( cmap );

          break;
        }
      }
    }
  }